

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::HttpEntityBodyWriter::~HttpEntityBodyWriter(HttpEntityBodyWriter *this)

{
  HttpOutputStream *this_00;
  char *pcVar1;
  size_t sVar2;
  HttpOutputStream *inner;
  String local_28;
  
  (this->super_AsyncOutputStream)._vptr_AsyncOutputStream =
       (_func_int **)&PTR___cxa_pure_virtual_0063eb00;
  if (this->finished == false) {
    this_00 = (this->weakInner).ptr;
    if (this_00 == (HttpOutputStream *)0x0) {
      if (kj::_::Debug::minSeverity < 3) {
        getStackTrace();
        kj::_::Debug::log<char_const(&)[55],kj::String>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x966,ERROR,
                   "\"HTTP body output stream outlived underlying connection\", kj::getStackTrace()"
                   ,(char (*) [55])"HTTP body output stream outlived underlying connection",
                   &local_28);
        sVar2 = local_28.content.size_;
        pcVar1 = local_28.content.ptr;
        if (local_28.content.ptr != (char *)0x0) {
          local_28.content.ptr = (char *)0x0;
          local_28.content.size_ = 0;
          (**(local_28.content.disposer)->_vptr_ArrayDisposer)
                    (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
        }
      }
    }
    else {
      WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>::unsetCurrentWrapper
                (&this_00->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>,
                 &this->weakInner);
      HttpOutputStream::abortBody(this_00);
    }
  }
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

~HttpEntityBodyWriter() noexcept(false) {
    if (!finished) {
      KJ_IF_SOME(inner, weakInner) {
        inner.unsetCurrentWrapper(weakInner);
        inner.abortBody();
      } else {
        // Since we're in a destructor, log an error instead of throwing.
        KJ_LOG(ERROR, "HTTP body output stream outlived underlying connection",
            kj::getStackTrace());
      }
    }